

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ExpressionTemplateTest::constructionAndAssignmentTest(ExpressionTemplateTest *this)

{
  int iVar1;
  bool bVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  value_type vVar6;
  value_type vVar7;
  size_t sVar8;
  size_t sVar9;
  logic_error *plVar10;
  runtime_error *prVar11;
  size_t sVar12;
  Marray<int,_std::allocator<unsigned_long>_> r;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  size_t local_140;
  unsigned_long local_138;
  allocator_type local_129;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_128;
  View<int,_false,_std::allocator<unsigned_long>_> local_110;
  undefined1 local_c8 [16];
  size_t *local_b8;
  size_t local_a0;
  undefined1 local_88 [16];
  size_t *local_78;
  size_t local_60;
  unsigned_long local_48 [3];
  
  local_48[0] = 2;
  local_48[1] = 3;
  local_48[2] = 2;
  local_88._0_8_ = this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),local_48,
             (unsigned_long *)&stack0xffffffffffffffd0,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_110);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88);
  local_c8._0_8_ = this->dataInt_ + 2;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_c8 + 8),local_48,
             (unsigned_long *)&stack0xffffffffffffffd0,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_110);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  ::BinaryViewExpression
            (&local_128,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             local_88,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_c8);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<andres::BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>,int>
            ((Marray<int,std::allocator<unsigned_long>> *)&local_110,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>,_int>
              *)&local_128,&local_129);
  local_138 = 0;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    local_140 = 0;
    do {
      sVar12 = 0;
      bVar5 = true;
      do {
        bVar2 = bVar5;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_110);
        piVar3 = local_110.data_;
        if ((local_110.data_ == (pointer)0x0) || (local_110.geometry_.dimension_ != 3)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Assertion failed.");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides(&local_110,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>(&local_110,3,local_140,local_138);
        iVar1 = piVar3[sVar8 * sVar12 + sVar9];
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_128,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_88,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                             *)local_c8);
        vVar6 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_128,sVar12,local_140,local_138);
        if (iVar1 != vVar6) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        sVar12 = 1;
        bVar5 = false;
      } while (bVar2);
      local_140 = local_140 + 1;
    } while (local_140 != 3);
    local_138 = 1;
    bVar5 = false;
  } while (bVar4);
  andres::
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  ::BinaryViewExpression
            ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
              *)&local_128,
             (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
             local_88,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_c8);
  andres::Marray<int,std::allocator<unsigned_long>>::operator=
            ((Marray<int,std::allocator<unsigned_long>> *)&local_110,
             (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
              *)&local_128);
  bVar5 = true;
  local_138 = 0;
  do {
    local_140 = 0;
    do {
      sVar12 = 0;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_110);
        piVar3 = local_110.data_;
        if ((local_110.data_ == (pointer)0x0) || (local_110.geometry_.dimension_ != 3)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Assertion failed.");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar8 = andres::View<int,_false,_std::allocator<unsigned_long>_>::strides(&local_110,0);
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::
                elementAccessHelper<unsigned_long>(&local_110,3,local_140,local_138);
        iVar1 = piVar3[sVar8 * sVar12 + sVar9];
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    *)&local_128,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   local_88,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                             *)local_c8);
        vVar7 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                              *)&local_128,sVar12,local_140,local_138);
        if (iVar1 != vVar7) {
          plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar10,"test failed.");
          __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        sVar12 = 1;
        bVar4 = false;
      } while (bVar2);
      local_140 = local_140 + 1;
    } while (local_140 != 3);
    local_138 = 1;
    bVar4 = !bVar5;
    bVar5 = false;
    if (bVar4) {
      operator_delete(local_110.data_,local_110.geometry_.size_ << 2);
      operator_delete(local_110.geometry_.shape_,local_110.geometry_.dimension_ * 0x18);
      operator_delete(local_b8,local_a0 * 0x18);
      operator_delete(local_78,local_60 * 0x18);
      return;
    }
  } while( true );
}

Assistant:

void ExpressionTemplateTest::constructionAndAssignmentTest()
{
    // Marray
    {
        std::size_t shape[] = {2, 3, 2};
        andres::View<int> v(shape, shape+3, dataInt_);
        andres::View<int> w(shape, shape+3, dataInt_ + 2);
        andres::Marray<int> r(v + w); // construction
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v + w)(x,y,z) );
                }
            }
        }
        r = v * w; // assignment
        for(std::size_t z=0; z<2; ++z) {
            for(std::size_t y=0; y<3; ++y) {
                for(std::size_t x=0; x<2; ++x) {
                    test( r(x,y,z) == (v * w)(x,y,z) );
                }
            }
        }
    }
}